

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void disas_m68k_movec(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  TCGContext_conflict2 *tcg_ctx_00;
  TCGv_ptr pTVar1;
  uint16_t uVar2;
  TCGv_i32 pTVar3;
  TCGv_i32 local_38;
  TCGv_i32 reg;
  uint16_t ext;
  TCGContext_conflict2 *tcg_ctx;
  uint16_t insn_local;
  DisasContext_conflict2 *s_local;
  CPUM68KState_conflict *env_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  if ((((s->base).tb)->flags & 0x2000) == 0) {
    gen_exception(s,(s->base).pc_next,8);
  }
  else {
    uVar2 = read_im16(env,s);
    if ((uVar2 & 0x8000) == 0) {
      local_38 = tcg_ctx_00->cpu_dregs[(int)((int)(uint)uVar2 >> 0xc & 7)];
    }
    else {
      local_38 = get_areg(s,(int)(uint)uVar2 >> 0xc & 7);
    }
    if ((insn & 1) == 0) {
      pTVar1 = tcg_ctx_00->cpu_env;
      pTVar3 = tcg_const_i32_m68k(tcg_ctx_00,uVar2 & 0xfff);
      gen_helper_m68k_movec_from(tcg_ctx_00,local_38,pTVar1,pTVar3);
    }
    else {
      pTVar1 = tcg_ctx_00->cpu_env;
      pTVar3 = tcg_const_i32_m68k(tcg_ctx_00,uVar2 & 0xfff);
      gen_helper_m68k_movec_to(tcg_ctx_00,pTVar1,pTVar3,local_38);
    }
    gen_exit_tb(s);
  }
  return;
}

Assistant:

DISAS_INSN(m68k_movec)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    uint16_t ext;
    TCGv reg;

    if (IS_USER(s)) {
        gen_exception(s, s->base.pc_next, EXCP_PRIVILEGE);
        return;
    }

    ext = read_im16(env, s);

    if (ext & 0x8000) {
        reg = AREG(ext, 12);
    } else {
        reg = DREG(ext, 12);
    }
    if (insn & 1) {
        gen_helper_m68k_movec_to(tcg_ctx, tcg_ctx->cpu_env, tcg_const_i32(tcg_ctx, ext & 0xfff), reg);
    } else {
        gen_helper_m68k_movec_from(tcg_ctx, reg, tcg_ctx->cpu_env, tcg_const_i32(tcg_ctx, ext & 0xfff));
    }
    gen_exit_tb(s);
}